

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O0

bool __thiscall ON_UuidIndexList::RemoveUuid(ON_UuidIndexList *this,ON_UUID uuid)

{
  uint uVar1;
  ON_UuidIndex *pOVar2;
  uint i;
  ON_UuidIndex *p;
  ON_UuidIndexList *this_local;
  ON_UUID uuid_local;
  
  uuid_local._0_8_ = uuid.Data4;
  this_local = uuid._0_8_;
  pOVar2 = SearchHelper(this,(ON_UUID *)&this_local);
  if (pOVar2 != (ON_UuidIndex *)0x0) {
    (pOVar2->m_id).Data1 = 0xffffffff;
    (pOVar2->m_id).Data2 = 0xffff;
    (pOVar2->m_id).Data3 = 0xffff;
    (pOVar2->m_id).Data4[0] = 0xff;
    (pOVar2->m_id).Data4[1] = 0xff;
    (pOVar2->m_id).Data4[2] = 0xff;
    (pOVar2->m_id).Data4[3] = 0xff;
    (pOVar2->m_id).Data4[4] = 0xff;
    (pOVar2->m_id).Data4[5] = 0xff;
    (pOVar2->m_id).Data4[6] = 0xff;
    (pOVar2->m_id).Data4[7] = 0xff;
    this->m_removed_count = this->m_removed_count + 1;
    uVar1 = (uint)(((long)pOVar2 - (long)(this->super_ON_SimpleArray<ON_UuidIndex>).m_a) / 0x14);
    if (uVar1 < this->m_sorted_count) {
      this->m_sorted_count = uVar1;
    }
  }
  return pOVar2 != (ON_UuidIndex *)0x0;
}

Assistant:

bool ON_UuidIndexList::RemoveUuid(ON_UUID uuid)
{
  ON_UuidIndex* p = SearchHelper(&uuid);
  if ( 0 != p )
  {
    p->m_id = ON_max_uuid;
    m_removed_count++;
    unsigned int i = (unsigned int)(p - m_a);
    if ( i < m_sorted_count )
      m_sorted_count = i;
  }
  return (0!=p);
}